

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::buildValidSubstitutionListB
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,
          SchemaElementDecl *subsElemDecl)

{
  uint key2;
  QName *pQVar1;
  XMLCh *key1;
  ulong uVar2;
  BaseRefVectorOf<xercesc_4_0::SchemaInfo> *this_00;
  XMLSize_t XVar3;
  GrammarResolver *this_01;
  ulong uVar4;
  int iVar5;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar6;
  SchemaInfo *pSVar7;
  Grammar *pGVar8;
  undefined4 extraout_var;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *toCopy;
  SchemaElementDecl *subsElemDecl_00;
  ulong uVar9;
  XMLSize_t XVar10;
  bool bVar11;
  
  subsElemDecl_00 = subsElemDecl->fSubstitutionGroupElem;
  do {
    if (subsElemDecl_00 == (SchemaElementDecl *)0x0) {
      return;
    }
    pQVar1 = (subsElemDecl_00->super_XMLElementDecl).fElementName;
    key2 = pQVar1->fURIId;
    key1 = pQVar1->fLocalPart;
    pVVar6 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
             ::get(this->fValidSubstitutionGroups,key1,key2);
    if (pVVar6 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
      iVar5 = 3;
      if (this->fTargetNSURI != key2) {
        this_01 = this->fGrammarResolver;
        iVar5 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                          (this->fURIStringPool,(ulong)key2);
        pGVar8 = GrammarResolver::getGrammar(this_01,(XMLCh *)CONCAT44(extraout_var,iVar5));
        iVar5 = 3;
        if (pGVar8 == (Grammar *)0x0) {
          bVar11 = false;
          pVVar6 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0;
        }
        else {
          toCopy = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                   ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                          *)pGVar8[10].super_XSerializable._vptr_XSerializable,key1,key2);
          if (toCopy == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
            bVar11 = false;
            pVVar6 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0;
          }
          else {
            pVVar6 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
                     XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
            ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf(pVVar6,toCopy);
            RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
            ::put(this->fValidSubstitutionGroups,key1,key2,pVVar6);
            iVar5 = 0;
            bVar11 = true;
          }
        }
        if (bVar11) goto LAB_0033d407;
      }
    }
    else {
LAB_0033d407:
      uVar2 = pVVar6->fCurCount;
      bVar11 = uVar2 != 0;
      if (bVar11) {
        if (*pVVar6->fElemList == elemDecl) {
          iVar5 = 3;
          goto LAB_0033d61c;
        }
        uVar4 = 1;
        do {
          uVar9 = uVar4;
          if (uVar2 == uVar9) break;
          uVar4 = uVar9 + 1;
        } while (pVVar6->fElemList[uVar9] != elemDecl);
        bVar11 = uVar9 < uVar2;
      }
      iVar5 = 3;
      if ((!bVar11) &&
         (bVar11 = isSubstitutionGroupValid
                             (this,elem,subsElemDecl_00,elemDecl->fComplexTypeInfo,
                              elemDecl->fDatatypeValidator,(XMLCh *)0x0,false), bVar11)) {
        ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ensureExtraCapacity(pVVar6,1);
        XVar10 = pVVar6->fCurCount;
        pVVar6->fCurCount = XVar10 + 1;
        pVVar6->fElemList[XVar10] = elemDecl;
        this_00 = &this->fSchemaInfo->fImportingInfoList->
                   super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
        if (this_00->fCurCount != 0) {
          XVar10 = 0;
          do {
            pSVar7 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt(this_00,XVar10);
            pGVar8 = GrammarResolver::getGrammar(this->fGrammarResolver,pSVar7->fTargetNSURIString);
            pVVar6 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                     ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                            *)pGVar8[10].super_XSerializable._vptr_XSerializable,key1,key2);
            if (pVVar6 != (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
              uVar2 = pVVar6->fCurCount;
              bVar11 = uVar2 != 0;
              if (bVar11) {
                if (*pVVar6->fElemList == elemDecl) goto LAB_0033d53c;
                uVar4 = 1;
                do {
                  uVar9 = uVar4;
                  if (uVar2 == uVar9) break;
                  uVar4 = uVar9 + 1;
                } while (pVVar6->fElemList[uVar9] != elemDecl);
                bVar11 = uVar9 < uVar2;
              }
              if (!bVar11) {
                ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ensureExtraCapacity(pVVar6,1);
                XVar3 = pVVar6->fCurCount;
                pVVar6->fCurCount = XVar3 + 1;
                pVVar6->fElemList[XVar3] = elemDecl;
              }
            }
LAB_0033d53c:
            XVar10 = XVar10 + 1;
          } while (XVar10 < this_00->fCurCount);
        }
        subsElemDecl_00 = subsElemDecl_00->fSubstitutionGroupElem;
        iVar5 = 0;
      }
    }
LAB_0033d61c:
    if (iVar5 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void
TraverseSchema::buildValidSubstitutionListB(const DOMElement* const elem,
                                            SchemaElementDecl* const elemDecl,
                                            SchemaElementDecl* const subsElemDecl) {

    SchemaElementDecl* chainElemDecl = subsElemDecl->getSubstitutionGroupElem();

    while (chainElemDecl) {

        int chainElemURI = chainElemDecl->getURI();
        XMLCh* chainElemName = chainElemDecl->getBaseName();
        ValueVectorOf<SchemaElementDecl*>* validSubsElements =
            fValidSubstitutionGroups->get(chainElemName, chainElemURI);

        if (!validSubsElements) {

            if (fTargetNSURI == chainElemURI) {
                break; // an error must have occured
            }

            SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(fURIStringPool->getValueForId(chainElemURI));

            if (!aGrammar)
                break;

            validSubsElements = aGrammar->getValidSubstitutionGroups()->get(chainElemName, chainElemURI);

            if (!validSubsElements) {
                break;
            }

            validSubsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(*validSubsElements);
            fValidSubstitutionGroups->put((void*) chainElemName, chainElemURI, validSubsElements);
        }

        if (validSubsElements->containsElement(elemDecl) ||
            !isSubstitutionGroupValid(elem, chainElemDecl, elemDecl->getComplexTypeInfo(),
                                      elemDecl->getDatatypeValidator(), 0, false)) {
            break;
        }

        validSubsElements->addElement(elemDecl);

        // update related subs. info in case of circular import
        BaseRefVectorEnumerator<SchemaInfo> importingEnum = fSchemaInfo->getImportingListEnumerator();

        while (importingEnum.hasMoreElements()) {

            const SchemaInfo& curRef = importingEnum.nextElement();
            SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(curRef.getTargetNSURIString());
            ValueVectorOf<SchemaElementDecl*>* subsElemList =
                aGrammar->getValidSubstitutionGroups()->get(chainElemName, chainElemURI);

            if (subsElemList && !subsElemList->containsElement(elemDecl)) {
                subsElemList->addElement(elemDecl);
            }
        }

        chainElemDecl = chainElemDecl->getSubstitutionGroupElem();
    }
}